

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autotune.cc
# Opt level: O3

void __thiscall fasttext::Autotune::printInfo(Autotune *this,double maxDuration)

{
  long lVar1;
  ostream *poVar2;
  double dVar3;
  double dVar4;
  double __args;
  ClockPrint local_24;
  
  dVar4 = this->elapsed_ / maxDuration;
  __args = 1.0;
  if (dVar4 <= 1.0) {
    __args = dVar4;
  }
  dVar3 = maxDuration - this->elapsed_;
  dVar4 = 0.0;
  if (0.0 <= dVar3) {
    dVar4 = dVar3;
  }
  if (0 < this->verbose_) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\r",1);
    *(uint *)(std::ios_base::Init::~Init + *(long *)(std::cerr + -0x18)) =
         *(uint *)(std::ios_base::Init::~Init + *(long *)(std::cerr + -0x18)) & 0xfffffefb | 4;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Progress: ",10);
    lVar1 = std::cerr;
    *(undefined8 *)(&std::runtime_error::typeinfo + *(long *)(std::cerr + -0x18)) = 1;
    *(undefined8 *)(std::istream::_M_extract<float> + *(long *)(lVar1 + -0x18)) = 5;
    poVar2 = std::ostream::_M_insert<double>(__args * 100.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"%",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," Trials: ",9);
    *(undefined8 *)(std::istream::_M_extract<float> + *(long *)(std::cerr + -0x18)) = 4;
    std::ostream::operator<<((ostream *)&std::cerr,this->trials_);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," Best score: ",0xd);
    lVar1 = std::cerr;
    *(undefined8 *)(std::istream::_M_extract<float> + *(long *)(std::cerr + -0x18)) = 9;
    *(undefined8 *)(&std::runtime_error::typeinfo + *(long *)(lVar1 + -0x18)) = 6;
    dVar3 = this->bestScore_;
    if ((dVar3 != -1.0) || (NAN(dVar3))) {
      std::ostream::_M_insert<double>(dVar3);
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"unknown",7);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," ETA: ",6);
    utils::ClockPrint::ClockPrint(&local_24,(int)dVar4);
    utils::operator<<((ostream *)&std::cerr,&local_24);
    std::ostream::flush();
  }
  if ((this->callback_).super__Function_base._M_manager != (_Manager_type)0x0) {
    std::function<void_(double,_int,_double,_double)>::operator()
              (&this->callback_,__args,this->trials_,this->bestScore_,(double)(int)dVar4);
  }
  return;
}

Assistant:

void Autotune::printInfo(double maxDuration) {
  double progress = elapsed_ / maxDuration;
  progress = std::min(progress, 1.0);
  int32_t eta = (int32_t)std::max(maxDuration - elapsed_, 0.0);

  if (this->verbose_ > 0)
  {
      std::cerr << "\r";
      std::cerr << std::fixed;
      std::cerr << "Progress: ";
      std::cerr << std::setprecision(1) << std::setw(5) << progress * 100 << "%";
      std::cerr << " Trials: " << std::setw(4) << trials_;
      std::cerr << " Best score: " << std::setw(9) << std::setprecision(6);
      if (bestScore_ == kUnknownBestScore) {
          std::cerr << "unknown";
      }
      else {
          std::cerr << bestScore_;
      }

      std::cerr << " ETA: "
                << utils::ClockPrint(eta);
      std::cerr << std::flush;
  }

  if (this->callback_)
  {
      this->callback_(progress, trials_, bestScore_, eta);
  }
}